

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawData::DeIndexAllBuffers(ImDrawData *this)

{
  int iVar1;
  ImDrawList *pIVar2;
  ImDrawVert *pIVar3;
  long lVar4;
  uint *__src;
  ImVec2 IVar5;
  ImDrawVert *pIVar6;
  uint *__dest;
  ulong uVar7;
  ulong uVar8;
  int rhs_size;
  long lVar9;
  uint uVar10;
  uint uVar11;
  undefined8 local_48;
  ImDrawVert *pIStack_40;
  
  local_48 = 0;
  pIStack_40 = (ImDrawVert *)0x0;
  this->TotalIdxCount = 0;
  this->TotalVtxCount = 0;
  if (0 < this->CmdListsCount) {
    lVar9 = 0;
    do {
      pIVar2 = this->CmdLists[lVar9];
      uVar11 = (pIVar2->IdxBuffer).Size;
      if (uVar11 != 0) {
        if (local_48._4_4_ < (int)uVar11) {
          if (local_48._4_4_ == 0) {
            uVar10 = 8;
          }
          else {
            uVar10 = local_48._4_4_ / 2 + local_48._4_4_;
          }
          if ((int)uVar10 <= (int)uVar11) {
            uVar10 = uVar11;
          }
          if (local_48._4_4_ < (int)uVar10) {
            pIVar6 = (ImDrawVert *)ImGui::MemAlloc((long)(int)uVar10 * 0x14);
            if (pIStack_40 != (ImDrawVert *)0x0) {
              memcpy(pIVar6,pIStack_40,(long)(int)local_48 * 0x14);
              ImGui::MemFree(pIStack_40);
            }
            local_48 = (ulong)uVar10 << 0x20;
            pIStack_40 = pIVar6;
          }
        }
        if (0 < (pIVar2->IdxBuffer).Size) {
          uVar7 = 0;
          if (0 < (int)uVar11) {
            uVar7 = (ulong)uVar11;
          }
          uVar8 = 0;
          pIVar6 = pIStack_40;
          do {
            uVar10 = (pIVar2->IdxBuffer).Data[uVar8];
            if (((pIVar2->VtxBuffer).Size <= (int)uVar10) || (uVar7 == uVar8)) {
              __assert_fail("i < Size",
                            "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                            ,0x52e,"T &ImVector<ImDrawVert>::operator[](int) [T = ImDrawVert]");
            }
            pIVar3 = (pIVar2->VtxBuffer).Data;
            pIVar6->col = pIVar3[(int)uVar10].col;
            pIVar3 = pIVar3 + (int)uVar10;
            IVar5 = pIVar3->uv;
            pIVar6->pos = pIVar3->pos;
            pIVar6->uv = IVar5;
            uVar8 = uVar8 + 1;
            pIVar6 = pIVar6 + 1;
          } while ((long)uVar8 < (long)(pIVar2->IdxBuffer).Size);
        }
        lVar4._0_4_ = (pIVar2->VtxBuffer).Size;
        lVar4._4_4_ = (pIVar2->VtxBuffer).Capacity;
        (pIVar2->VtxBuffer).Size = uVar11;
        (pIVar2->VtxBuffer).Capacity = local_48._4_4_;
        pIVar6 = (pIVar2->VtxBuffer).Data;
        (pIVar2->VtxBuffer).Data = pIStack_40;
        iVar1 = (pIVar2->IdxBuffer).Capacity;
        if (iVar1 < 0) {
          uVar11 = iVar1 / 2 + iVar1;
          if ((int)uVar11 < 1) {
            uVar11 = 0;
          }
          __dest = (uint *)ImGui::MemAlloc((ulong)uVar11 * 4);
          __src = (pIVar2->IdxBuffer).Data;
          if (__src != (uint *)0x0) {
            memcpy(__dest,__src,(long)(pIVar2->IdxBuffer).Size << 2);
            ImGui::MemFree((pIVar2->IdxBuffer).Data);
          }
          (pIVar2->IdxBuffer).Data = __dest;
          (pIVar2->IdxBuffer).Capacity = uVar11;
        }
        (pIVar2->IdxBuffer).Size = 0;
        this->TotalVtxCount = this->TotalVtxCount + (pIVar2->VtxBuffer).Size;
        local_48 = lVar4;
        pIStack_40 = pIVar6;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < this->CmdListsCount);
  }
  if (pIStack_40 != (ImDrawVert *)0x0) {
    ImGui::MemFree(pIStack_40);
  }
  return;
}

Assistant:

void ImDrawListSplitter::Split(ImDrawList* draw_list, int channels_count)
{
    IM_ASSERT(_Current == 0 && _Count <= 1 && "Nested channel splitting is not supported. Please use separate instances of ImDrawListSplitter.");
    int old_channels_count = _Channels.Size;
    if (old_channels_count < channels_count)
        _Channels.resize(channels_count);
    _Count = channels_count;

    // Channels[] (24/32 bytes each) hold storage that we'll swap with draw_list->_CmdBuffer/_IdxBuffer
    // The content of Channels[0] at this point doesn't matter. We clear it to make state tidy in a debugger but we don't strictly need to.
    // When we switch to the next channel, we'll copy draw_list->_CmdBuffer/_IdxBuffer into Channels[0] and then Channels[1] into draw_list->CmdBuffer/_IdxBuffer
    memset(&_Channels[0], 0, sizeof(ImDrawChannel));
    for (int i = 1; i < channels_count; i++)
    {
        if (i >= old_channels_count)
        {
            IM_PLACEMENT_NEW(&_Channels[i]) ImDrawChannel();
        }
        else
        {
            _Channels[i]._CmdBuffer.resize(0);
            _Channels[i]._IdxBuffer.resize(0);
        }
        if (_Channels[i]._CmdBuffer.Size == 0)
        {
            ImDrawCmd draw_cmd;
            draw_cmd.ClipRect = draw_list->_ClipRectStack.back();
            draw_cmd.TextureId = draw_list->_TextureIdStack.back();
            _Channels[i]._CmdBuffer.push_back(draw_cmd);
        }
    }
}